

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::updateLastInputTime(WindowImplX11 *this,Time time)

{
  Atom AVar1;
  long in_RSI;
  long in_RDI;
  Atom netWmUserTime;
  allocator in_stack_ffffffffffffffc7;
  string *in_stack_ffffffffffffffc8;
  long local_10 [2];
  
  if ((in_RSI != 0) && (in_RSI != *(long *)(in_RDI + 0x438))) {
    local_10[0] = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc8,"_NET_WM_USER_TIME",
               (allocator *)&stack0xffffffffffffffc7);
    AVar1 = getAtom(in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    if (AVar1 != 0) {
      XChangeProperty(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),AVar1,6,0x20,0
                      ,local_10,1);
    }
    *(long *)(in_RDI + 0x438) = local_10[0];
  }
  return;
}

Assistant:

void WindowImplX11::updateLastInputTime(::Time time)
{
    if (time && (time != m_lastInputTime))
    {
        Atom netWmUserTime = getAtom("_NET_WM_USER_TIME", true);

        if (netWmUserTime)
        {
            XChangeProperty(m_display,
                            m_window,
                            netWmUserTime,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&time),
                            1);
        }

        m_lastInputTime = time;
    }
}